

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase211::run(TestCase211 *this)

{
  unsigned_long uVar1;
  uint local_1a4;
  char *local_1a0;
  Fault f;
  Orphan<capnp::Text> orphan;
  Builder root;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  bool local_108;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  _kjCondition._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Text>(&orphan,(Orphanage *)&_kjCondition,8);
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  uVar1 = (long)root._builder.data - 1;
  _kjCondition.left = 8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = uVar1 == 8;
  _kjCondition.right = uVar1;
  if (_kjCondition.result) {
    OrphanBuilder::asText((Builder *)&_kjCondition,&orphan.builder);
    *(undefined8 *)_kjCondition.right = 0x3837363534333231;
    MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
              (&root,&builder.super_MessageBuilder);
    capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField(&root,&orphan);
    local_1a0 = "12345678";
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField((Builder *)&f,&root);
    kj::_::DebugExpression<char_const(&)[9]>::operator==
              ((DebugComparison<const_char_(&)[9],_capnp::Text::Builder> *)&_kjCondition,
               (DebugExpression<char_const(&)[9]> *)&local_1a0,(Builder *)&f);
    if ((local_108 == false) && (kj::_::Debug::minSeverity < 3)) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField((Builder *)&f,&root);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[9],capnp::Text::Builder>&,char_const(&)[9],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(\\\"12345678\\\") == (root.getTextField())\", _kjCondition, \"12345678\", root.getTextField()"
                 ,(char (*) [55])"failed: expected (\"12345678\") == (root.getTextField())",
                 (DebugComparison<const_char_(&)[9],_capnp::Text::Builder> *)&_kjCondition,
                 (char (*) [9])"12345678",(Builder *)&f);
    }
    OrphanBuilder::~OrphanBuilder(&orphan.builder);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_1a4 = 8;
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  local_1a0 = (char *)((long)root._builder.data + -1);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xd7,FAILED,"(8u) == (orphan.get().size())","_kjCondition,8u, orphan.get().size()",
             &_kjCondition,&local_1a4,(unsigned_long *)&local_1a0);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Orphans, OrphanageText) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphan<Text>(8);
  ASSERT_EQ(8u, orphan.get().size());
  memcpy(orphan.get().begin(), "12345678", 8);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
  EXPECT_EQ("12345678", root.getTextField());
}